

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3BitvecDestroy(Bitvec *p)

{
  long lVar1;
  
  if (p != (Bitvec *)0x0) {
    if (p->iDivisor != 0) {
      for (lVar1 = 2; lVar1 != 0x40; lVar1 = lVar1 + 1) {
        sqlite3BitvecDestroy(*(Bitvec **)(&p->iSize + lVar1 * 2));
      }
    }
    sqlite3_free(p);
    return;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3BitvecDestroy(Bitvec *p){
  if( p==0 ) return;
  if( p->iDivisor ){
    unsigned int i;
    for(i=0; i<BITVEC_NPTR; i++){
      sqlite3BitvecDestroy(p->u.apSub[i]);
    }
  }
  sqlite3_free(p);
}